

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O2

gint tb_tc_cmp(gconstpointer ap,gconstpointer bp)

{
  long lVar1;
  ulong uVar2;
  gint gVar3;
  int iVar4;
  ulong uVar5;
  tb_tc *b;
  tb_tc *a;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  
  lVar1 = *(long *)((long)ap + 8);
  if (lVar1 == 0) {
    uVar2 = *ap;
    uVar5 = *(long *)((long)bp + 8) + *bp;
    bVar6 = uVar2 < *bp;
    bVar7 = uVar5 < uVar2;
    bVar8 = uVar5 == uVar2;
  }
  else {
    if (*(long *)((long)bp + 8) != 0) {
      if (*bp < *ap) {
        gVar3 = 1;
      }
      else {
        if (*bp <= *ap) {
          if (lVar1 == *(long *)((long)bp + 8)) {
            return 0;
          }
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg.c"
                     ,0x144,"a->size == b->size");
        }
        gVar3 = -1;
      }
      return gVar3;
    }
    uVar2 = *bp;
    uVar5 = lVar1 + *ap;
    bVar6 = uVar2 < *ap;
    bVar7 = uVar5 < uVar2;
    bVar8 = uVar5 == uVar2;
  }
  iVar4 = 1;
  if (!bVar7 && !bVar8) {
    iVar4 = -(uint)bVar6;
  }
  return iVar4;
}

Assistant:

static gint tb_tc_cmp(gconstpointer ap, gconstpointer bp)
{
    const struct tb_tc *a = ap;
    const struct tb_tc *b = bp;

    /*
     * When both sizes are set, we know this isn't a lookup.
     * This is the most likely case: every TB must be inserted; lookups
     * are a lot less frequent.
     */
    if (likely(a->size && b->size)) {
        if (a->ptr > b->ptr) {
            return 1;
        } else if (a->ptr < b->ptr) {
            return -1;
        }
        /* a->ptr == b->ptr should happen only on deletions */
        g_assert(a->size == b->size);
        return 0;
    }
    /*
     * All lookups have either .size field set to 0.
     * From the glib sources we see that @ap is always the lookup key. However
     * the docs provide no guarantee, so we just mark this case as likely.
     */
    if (likely(a->size == 0)) {
        return ptr_cmp_tb_tc(a->ptr, b);
    }
    return ptr_cmp_tb_tc(b->ptr, a);
}